

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

void webfront::msg::FunctionCall::decodeParameter<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
               span<const_std::byte,_18446744073709551615UL> *data)

{
  initializer_list<char> __l;
  ostream *poVar1;
  size_type sVar2;
  runtime_error *prVar3;
  reference peVar4;
  allocator<char> *__a;
  span<const_std::byte,_18446744073709551615UL> *this;
  span<const_std::byte,_18446744073709551615UL> *in_RSI;
  span<const_std::byte,_18446744073709551615UL> sVar5;
  uint16_t size_1;
  size_t size;
  CodedType codedType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> *in_stack_fffffffffffffee8;
  span<const_std::byte,_18446744073709551615UL> *in_stack_fffffffffffffef0;
  byte *in_stack_fffffffffffffef8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  byte *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  initializer_list<char> local_b0;
  pointer local_a0;
  __extent_storage<18446744073709551615UL> local_98;
  allocator<char> local_89 [39];
  ushort local_62;
  pointer local_60;
  __extent_storage<18446744073709551615UL> local_58;
  allocator<char> local_49 [33];
  ulong local_28;
  element_type local_1d;
  span<const_std::byte,_18446744073709551615UL> *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cout,"decodeParameter with data size ");
  sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                    ((span<const_std::byte,_18446744073709551615UL> *)0x178a2c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1," bytes\n");
  sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                    ((span<const_std::byte,_18446744073709551615UL> *)0x178a55);
  if (sVar2 == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"Not enough data for msg::FunctionCall::decodeParameter");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar4 = std::span<const_std::byte,_18446744073709551615UL>::operator[](local_10,0);
  local_1d = *peVar4;
  switch(local_1d) {
  case 3:
    break;
  case 4:
    sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                      ((span<const_std::byte,_18446744073709551615UL> *)0x178b0e);
    if (sVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar4 = std::span<const_std::byte,_18446744073709551615UL>::operator[](local_10,1);
    local_28 = (ulong)*peVar4;
    sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                      ((span<const_std::byte,_18446744073709551615UL> *)0x178b9c);
    if (sVar2 < local_28 + 2) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::span<const_std::byte,_18446744073709551615UL>::operator[](local_10,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (size_type)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(local_49);
    sVar5 = std::span<const_std::byte,_18446744073709551615UL>::subspan
                      (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
                       (size_type)in_stack_fffffffffffffee0);
    local_60 = sVar5._M_ptr;
    local_10->_M_ptr = local_60;
    local_58 = sVar5._M_extent._M_extent_value;
    (local_10->_M_extent)._M_extent_value = local_58._M_extent_value;
    break;
  case 5:
  case 6:
    sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                      ((span<const_std::byte,_18446744073709551615UL> *)0x178d15);
    if (sVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::span<const_std::byte,_18446744073709551615UL>::operator[](local_10,1);
    std::copy_n<std::byte_const*,int,std::byte*>
              (in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
               in_stack_fffffffffffffef8);
    sVar2 = std::span<const_std::byte,_18446744073709551615UL>::size
                      ((span<const_std::byte,_18446744073709551615UL> *)0x178dad);
    if (sVar2 < local_62 + 3) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __a = (allocator<char> *)
          std::span<const_std::byte,_18446744073709551615UL>::operator[](local_10,3);
    this = (span<const_std::byte,_18446744073709551615UL> *)(ulong)local_62;
    __s = local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_stack_ffffffffffffff00,(char *)__s,(size_type)this,__a);
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(local_89);
    sVar5 = std::span<const_std::byte,_18446744073709551615UL>::subspan
                      (this,(size_type)__a,(size_type)in_stack_fffffffffffffee0);
    local_a0 = sVar5._M_ptr;
    local_10->_M_ptr = local_a0;
    local_98 = sVar5._M_extent._M_extent_value;
    (local_10->_M_extent)._M_extent_value = local_98._M_extent_value;
    break;
  default:
    std::initializer_list<char>::initializer_list(&local_b0);
    __l._M_len = (size_type)in_stack_fffffffffffffef0;
    __l._M_array = (iterator)in_stack_fffffffffffffee8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0,__l);
    break;
  case 0x12:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Wrong parameter type : std::tuple expected");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void decodeParameter(T& param, std::span<const std::byte>& data) {
        using namespace std;
        cout << "decodeParameter with data size " << data.size() << " bytes\n";
        if (data.size() == 0) throw runtime_error("Not enough data for msg::FunctionCall::decodeParameter");
        auto codedType = static_cast<CodedType>(data[0]);
        switch (codedType) {
        case CodedType::smallString:
            if constexpr (is_same_v<T, string>) {
                if (data.size() < 1u) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                auto size = static_cast<size_t>(data[1]);
                if (data.size() < 2u + size) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                param = string(reinterpret_cast<const char*>(&data[2]), size);
                data = data.subspan(2 + size);
            }
            break;
        case CodedType::string:
        case CodedType::exception:
            if constexpr (is_same_v<T, string>) {
                if (data.size() < 1u) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                uint16_t size;
                copy_n(&data[1], 2, reinterpret_cast<byte*>(&size));
                if (data.size() < 3u + size) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                param = string(reinterpret_cast<const char*>(&data[3]), size);
                data = data.subspan(3 + size);
            }
            break;
        case CodedType::number:
            if constexpr (is_arithmetic_v<T>) {
                double value;
                if (data.size() < 1u + sizeof(value))
                    throw runtime_error("Erroneous 'number' data feeded to msg::FunctionCall::decodeParameter");
                copy_n(&data[1], sizeof(value), reinterpret_cast<byte*>(&value));
                param = static_cast<T>(value);
                data = data.subspan(1 + sizeof(value));
            }
            break;
        case CodedType::tuple:
            if constexpr (is_tuple_v<T>) {
                auto tupleSize = static_cast<size_t>(data[1]);
                if (tuple_size_v<T> != tupleSize)
                    throw runtime_error("Parameter is a "s + to_string(tuple_size_v<T>) +
                                        " elements tuple but decoded tuple only has " + to_string(tupleSize) + " elements.");
                cout << "tuple expected\n";
                data = data.subspan(2);
                std::apply([&](auto&... tupleArgs) { ((decodeParameter(tupleArgs, data)), ...); }, param);
            }
            else
                throw runtime_error("Wrong parameter type : std::tuple expected");
            break;

        default: param = {};
        }
    }